

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O2

sds * duckdb_hll::sdssplitlen(char *s,ssize_t len,char *sep,int seplen,int *count)

{
  int iVar1;
  sds *ppcVar2;
  sds *ppcVar3;
  sds pcVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long local_70;
  
  if (-1 < len && 0 < seplen) {
    ppcVar2 = (sds *)malloc(0x28);
    iVar8 = 0;
    if (ppcVar2 != (sds *)0x0) {
      if (len != 0) {
        uVar9 = (ulong)(uint)seplen;
        iVar8 = 5;
        uVar7 = 0;
        local_70 = 0;
        lVar10 = 0;
        while (lVar10 < (long)(len - (ulong)(seplen - 1))) {
          ppcVar3 = ppcVar2;
          if (iVar8 < (int)(uVar7 + 2)) {
            iVar8 = iVar8 * 2;
            ppcVar3 = (sds *)realloc(ppcVar2,(long)iVar8 << 3);
            if (ppcVar3 == (sds *)0x0) goto LAB_00ec4679;
          }
          ppcVar2 = ppcVar3;
          if (((seplen == 1) && (s[lVar10] == *sep)) ||
             (iVar1 = bcmp(s + lVar10,sep,uVar9), lVar5 = lVar10, iVar1 == 0)) {
            pcVar4 = sdsnewlen(s + local_70,lVar10 - local_70);
            ppcVar3[(int)uVar7] = pcVar4;
            if (pcVar4 == (sds)0x0) goto LAB_00ec4679;
            uVar7 = uVar7 + 1;
            lVar5 = lVar10 + uVar9 + -1;
            local_70 = lVar10 + uVar9;
          }
          lVar10 = lVar5 + 1;
        }
        pcVar4 = sdsnewlen(s + local_70,len - local_70);
        ppcVar2[(int)uVar7] = pcVar4;
        if (pcVar4 == (sds)0x0) {
LAB_00ec4679:
          uVar6 = 0;
          uVar9 = (ulong)uVar7;
          if ((int)uVar7 < 1) {
            uVar9 = uVar6;
          }
          for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
            sdsfree(ppcVar2[uVar6]);
          }
          free(ppcVar2);
          iVar8 = 0;
          ppcVar2 = (sds *)0x0;
        }
        else {
          iVar8 = uVar7 + 1;
        }
      }
      *count = iVar8;
      return ppcVar2;
    }
  }
  return (sds *)0x0;
}

Assistant:

sds *sdssplitlen(const char *s, ssize_t len, const char *sep, int seplen, int *count) {
    int elements = 0, slots = 5;
    long start = 0, j;
    sds *tokens;

    if (seplen < 1 || len < 0) return NULL;

    tokens = (sds*) malloc(sizeof(sds)*slots);
    if (tokens == NULL) return NULL;

    if (len == 0) {
        *count = 0;
        return tokens;
    }
    for (j = 0; j < (len-(seplen-1)); j++) {
        /* make sure there is room for the next element and the final one */
        if (slots < elements+2) {
            sds *newtokens;

            slots *= 2;
            newtokens = (sds*) realloc(tokens,sizeof(sds)*slots);
            if (newtokens == NULL) goto cleanup;
            tokens = newtokens;
        }
        /* search the separator */
        if ((seplen == 1 && *(s+j) == sep[0]) || (memcmp(s+j,sep,seplen) == 0)) {
            tokens[elements] = sdsnewlen(s+start,j-start);
            if (tokens[elements] == NULL) goto cleanup;
            elements++;
            start = j+seplen;
            j = j+seplen-1; /* skip the separator */
        }
    }
    /* Add the final element. We are sure there is room in the tokens array. */
    tokens[elements] = sdsnewlen(s+start,len-start);
    if (tokens[elements] == NULL) goto cleanup;
    elements++;
    *count = elements;
    return tokens;

cleanup:
    {
        int i;
        for (i = 0; i < elements; i++) sdsfree(tokens[i]);
        free(tokens);
        *count = 0;
        return NULL;
    }
}